

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O1

void __thiscall
wigwag::detail::
listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::handler_node::release_token_impl(handler_node *this)

{
  atomic<int> *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *plVar2;
  intrusive_list_node *piVar3;
  
  life_assurance::intrusive_life_tokens::life_assurance::release_life_assurance
            (&this->super_life_assurance,&((this->_listenable_impl)._raw)->super_shared_data);
  (*(this->super_implementation)._vptr_implementation[3])(this);
  this_00 = (this->_handler).obj.
            super___shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  LOCK();
  paVar1 = &(this->super_life_assurance)._ref_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if ((paVar1->super___atomic_base<int>)._M_i == 0) {
    threading::shared_recursive_mutex::lock_primitive::lock_nonrecursive
              (&((this->_listenable_impl)._raw)->super_lock_primitive);
    plVar2 = (this->_listenable_impl)._raw;
    piVar3 = (this->super_intrusive_list_node)._next;
    piVar3->_prev = (this->super_intrusive_list_node)._prev;
    ((this->super_intrusive_list_node)._prev)->_next = piVar3;
    (this->super_intrusive_list_node)._next = &this->super_intrusive_list_node;
    (this->super_intrusive_list_node)._prev = &this->super_intrusive_list_node;
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               (plVar2->super_lock_primitive)._mutex.
               super___shared_ptr<std::recursive_mutex,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    (*(this->super_implementation)._vptr_implementation[2])(this);
    return;
  }
  return;
}

Assistant:

virtual void release_token_impl()
            {
                life_assurance::release_life_assurance(*_listenable_impl);

                if (!suppress_populator() && _listenable_impl->get_handler_processor().has_withdraw_state())
                {
                    _listenable_impl->get_lock_primitive().lock_nonrecursive();
                    auto sg = detail::at_scope_exit([&] { _listenable_impl->get_lock_primitive().unlock_nonrecursive(); } );
                    _listenable_impl->get_handler_processor().withdraw_state(_handler.ref());
                }

                _handler.ref().~handler_type();

                if (life_assurance::release_node())
                {
                    {
                        _listenable_impl->get_lock_primitive().lock_nonrecursive();
                        auto sg = detail::at_scope_exit([&] { _listenable_impl->get_lock_primitive().unlock_nonrecursive(); } );
                        _listenable_impl->get_handlers_container().erase(*this);
                    }
                    delete this;
                }
            }